

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

SymOpnd * IR::SymOpnd::New(Sym *sym,uint32 offset,IRType type,Func *func)

{
  undefined1 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  SymOpnd *pSVar5;
  
  if (sym == (Sym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x2a4,"(sym)","A SymOpnd needs a valid symbol.");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pSVar5 = (SymOpnd *)new<Memory::JitArenaAllocator>(0x20,func->m_alloc,0x3f1274);
  (pSVar5->super_Opnd)._vptr_Opnd = (_func_int **)0x0;
  (pSVar5->super_Opnd).m_valueType = (anon_union_2_4_ea848c7b_for_ValueType_13)0x0;
  (pSVar5->super_Opnd).m_type = TyIllegal;
  (pSVar5->super_Opnd).field_0xb = 0;
  (pSVar5->super_Opnd).m_kind = OpndKindInvalid;
  (pSVar5->super_Opnd).isDeleted = false;
  *(undefined2 *)&(pSVar5->super_Opnd).field_0xe = 0;
  pSVar5->m_sym = (Sym *)0x0;
  pSVar5->m_offset = 0;
  pSVar5->propertyOwnerValueType = (anon_union_2_4_ea848c7b_for_ValueType_13)0x0;
  *(undefined2 *)&pSVar5->field_0x1e = 0;
  (pSVar5->super_Opnd)._vptr_Opnd = (_func_int **)&PTR_DummyFunction_014ed940;
  ValueType::ValueType(&(pSVar5->super_Opnd).m_valueType);
  puVar1 = &(pSVar5->super_Opnd).field_0xb;
  *puVar1 = *puVar1 & 8;
  (pSVar5->super_Opnd).m_kind = OpndKindInvalid;
  (pSVar5->super_Opnd).isDeleted = false;
  (pSVar5->super_Opnd)._vptr_Opnd = (_func_int **)&PTR_DummyFunction_014ed900;
  ValueType::ValueType(&pSVar5->propertyOwnerValueType);
  pSVar5->m_sym = sym;
  pSVar5->m_offset = offset;
  (pSVar5->super_Opnd).m_type = type;
  puVar1 = &(pSVar5->super_Opnd).field_0xb;
  *puVar1 = *puVar1 & 0xf7;
  (pSVar5->super_Opnd).m_kind = OpndKindSym;
  return pSVar5;
}

Assistant:

SymOpnd *
SymOpnd::New(Sym *sym, uint32 offset, IRType type, Func *func)
{
    SymOpnd * symOpnd;

    AssertMsg(sym, "A SymOpnd needs a valid symbol.");

    symOpnd = JitAnew(func->m_alloc, IR::SymOpnd);

    symOpnd->m_sym = sym;
    symOpnd->m_offset = offset;
    symOpnd->m_type = type;
    symOpnd->SetIsJITOptimizedReg(false);


    symOpnd->m_kind = OpndKindSym;


    return symOpnd;
}